

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

ConfidentialTxOutReference * __thiscall
cfd::ConfidentialTransactionController::AddTxOut
          (ConfidentialTxOutReference *__return_storage_ptr__,
          ConfidentialTransactionController *this,Address *address,Amount *value,
          ConfidentialAssetId *asset)

{
  ByteData hash_data;
  Script locking_script;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  ConfidentialNonce local_88;
  Script local_60;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0,
             &(address->hash_).data_);
  core::Address::GetLockingScript(&local_60,address);
  core::ConfidentialNonce::ConfidentialNonce(&local_88);
  AddTxOut(__return_storage_ptr__,this,&local_60,value,asset,&local_88);
  core::ConfidentialNonce::~ConfidentialNonce(&local_88);
  core::Script::~Script(&local_60);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

const ConfidentialTxOutReference ConfidentialTransactionController::AddTxOut(
    const Address& address, const Amount& value,
    const ConfidentialAssetId& asset) {
  const ByteData hash_data = address.GetHash();
  Script locking_script = address.GetLockingScript();

  return AddTxOut(locking_script, value, asset, ConfidentialNonce());
}